

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  uint uVar1;
  SPIRType *pSVar2;
  SPIRFunction *meta_00;
  SPIRVariable *ib_type_00;
  SPIRType *ib_var_ref_00;
  StorageClass storage_00;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  ExecutionModel EVar6;
  TypedID<(spirv_cross::Types)2> TVar7;
  CompilerError *pCVar8;
  size_t sVar9;
  TypedID *pTVar10;
  TypedID<(spirv_cross::Types)1> *pTVar11;
  uint *ts_1;
  bool local_471;
  bool local_40a;
  bool local_409;
  byte local_3cb;
  bool local_3ca;
  bool local_3c9;
  SPIRType *local_3c0;
  bool attribute_load_store_1;
  bool storage_is_stage_io_1;
  bool is_composite_type_1;
  string local_3a0;
  ID local_380;
  allocator local_379;
  string local_378;
  ID local_358;
  uint32_t local_354;
  string local_350;
  TypeID local_330;
  uint local_32c;
  undefined1 auStack_328 [4];
  uint32_t mbr_idx_1;
  __buckets_ptr pp_Stack_320;
  size_type local_318;
  __node_base _Stack_310;
  size_type local_308;
  _Prime_rehash_policy _Stack_300;
  __node_base_ptr p_Stack_2f0;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  string var_chain_qual;
  string mbr_name_qual;
  string var_name;
  undefined1 local_238;
  bool storage_is_stage_io;
  bool attribute_load_store;
  bool is_composite_type;
  ID local_214;
  VariableID local_210;
  StorageClass local_20c;
  SPIRConstant *local_208;
  SPIRConstant *c;
  undefined1 local_1f8 [4];
  uint32_t initializer;
  SPIRType ptr_type;
  uint32_t local_a0;
  uint32_t var_id;
  uint32_t ptr_type_id;
  uint32_t ids;
  SPIRType *mbr_type;
  uint local_88;
  uint32_t mbr_idx;
  uint32_t elem_idx;
  uint32_t elem_cnt;
  uint32_t var_mbr_idx;
  uint32_t location;
  bool masked_block;
  bool needs_local_declaration;
  bool block_requires_flattening;
  uint32_t local_68;
  uint32_t local_64;
  byte local_5d;
  uint32_t local_5c;
  BuiltIn BStack_58;
  bool is_block;
  byte local_51;
  BuiltIn builtin;
  bool is_builtin;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_18;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_18 = this;
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar5);
  if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    local_3c0 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  else {
    local_3c0 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  _builtin = local_3c0;
  local_51 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
  local_5c = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  BStack_58 = Compiler::get_decoration((Compiler *)this,(ID)local_5c,BuiltIn);
  local_64 = (_builtin->super_IVariant).self.id;
  local_5d = Compiler::has_decoration((Compiler *)this,(ID)local_64,Block);
  if ((ib_var_ref_local._4_4_ == Output) &&
     (bVar3 = CompilerGLSL::is_stage_output_variable_masked
                        (&this->super_CompilerGLSL,(SPIRVariable *)meta_local), bVar3)) {
    emit_local_masked_variable
              (this,(SPIRVariable *)meta_local,
               (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
  }
  else {
    if (ib_var_ref_local._4_4_ == Input) {
      local_68 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      bVar3 = Compiler::has_decoration((Compiler *)this,(ID)local_68,DecorationPerVertexKHR);
      if (bVar3) {
        pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar8,"PerVertexKHR decoration is not supported in MSL.");
        __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
    }
    uVar5 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar5);
    if (_builtin->basetype == Struct) {
      bVar3 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
      local_3c9 = true;
      if (!bVar3) {
        local_3ca = false;
        if ((local_5d & 1) != 0) {
          local_3ca = VectorView<unsigned_int>::empty
                                (&(_builtin->array).super_VectorView<unsigned_int>);
        }
        local_3c9 = local_3ca;
      }
      var_mbr_idx._3_1_ = local_3c9;
      local_3cb = 0;
      if (((local_51 & 1) == 0) && (local_3cb = 0, local_3c9 != false)) {
        local_3cb = (entry_func->arguments).stack_storage.aligned_char[9];
      }
      var_mbr_idx._2_1_ = local_3cb & 1;
      if (var_mbr_idx._2_1_ != 0) {
        emit_local_masked_variable
                  (this,(SPIRVariable *)meta_local,
                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
      }
      if ((var_mbr_idx._3_1_ & 1) == 0) {
        add_plain_variable_to_interface_block
                  (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                   (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
      }
      else {
        var_mbr_idx._1_1_ = 0;
        elem_cnt = 0xffffffff;
        elem_idx = 0;
        mbr_idx = 1;
        bVar3 = Compiler::is_matrix((Compiler *)this,_builtin);
        if (bVar3) {
          bVar3 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar3) {
            pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError
                      (pCVar8,"MSL cannot emit arrays-of-matrices in input and output variables.");
            __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          mbr_idx = _builtin->columns;
        }
        else {
          bVar3 = Compiler::is_array((Compiler *)this,_builtin);
          if (bVar3) {
            sVar9 = VectorView<unsigned_int>::size
                              (&(_builtin->array).super_VectorView<unsigned_int>);
            if (sVar9 != 1) {
              pCVar8 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError
                        (pCVar8,"MSL cannot emit arrays-of-arrays in input and output variables.");
              __cxa_throw(pCVar8,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            mbr_idx = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,_builtin);
          }
        }
        for (local_88 = 0; local_88 < mbr_idx; local_88 = local_88 + 1) {
          for (mbr_type._4_4_ = 0; uVar1 = mbr_type._4_4_,
              sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(_builtin->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
              uVar1 < (uint)sVar9; mbr_type._4_4_ = mbr_type._4_4_ + 1) {
            BStack_58 = BuiltInMax;
            local_51 = Compiler::is_member_builtin
                                 ((Compiler *)this,_builtin,mbr_type._4_4_,&stack0xffffffffffffffa8)
            ;
            pTVar10 = (TypedID *)
                      VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                (&(_builtin->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                                 (ulong)mbr_type._4_4_);
            uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar10);
            _ptr_type_id = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar5);
            if ((ib_var_ref_local._4_4_ == Output) &&
               (bVar3 = CompilerGLSL::is_stage_output_block_member_masked
                                  (&this->super_CompilerGLSL,(SPIRVariable *)meta_local,
                                   mbr_type._4_4_,
                                   (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1)
                                  ), bVar3)) {
              elem_cnt = 0xffffffff;
              if ((local_5d & 1) != 0) {
                var_mbr_idx._1_1_ = 1;
              }
              if (((local_51 & 1) != 0) &&
                 (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) {
                local_a0 = ParsedIR::increase_bound_by
                                     (&(this->super_CompilerGLSL).super_Compiler.ir,2);
                ptr_type.member_name_cache._M_h._M_single_bucket._4_4_ = local_a0 + 1;
                var_id = local_a0;
                SPIRType::SPIRType((SPIRType *)local_1f8,_ptr_type_id);
                ptr_type.array_size_literal.stack_storage.aligned_char[4] = '\x01';
                ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ =
                     ptr_type.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
                pTVar11 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                    (&(_builtin->member_types).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                     ,(ulong)mbr_type._4_4_);
                ptr_type.image.access = pTVar11->id;
                ptr_type.pointer_depth = 3;
                c._4_4_ = 0;
                uVar5 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                if (uVar5 != 0) {
                  uVar5 = TypedID::operator_cast_to_unsigned_int
                                    ((TypedID *)&(meta_local->location_meta)._M_h._M_element_count);
                  local_208 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar5)
                  ;
                  if (local_208 != (SPIRConstant *)0x0) {
                    pTVar10 = (TypedID *)
                              VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                                        (&(local_208->subconstants).
                                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>
                                         ,(ulong)mbr_type._4_4_);
                    c._4_4_ = TypedID::operator_cast_to_unsigned_int(pTVar10);
                  }
                }
                Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,local_a0,(SPIRType *)local_1f8);
                local_20c = Output;
                var = (SPIRVariable *)((long)&c + 4);
                Compiler::
                set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                          ((Compiler *)this,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_,
                           &local_a0,&local_20c,(uint *)var);
                pSVar2 = var_type;
                TypedID<(spirv_cross::Types)2>::TypedID
                          (&local_210,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                SPIRFunction::add_local_variable((SPIRFunction *)pSVar2,local_210);
                SmallVector<unsigned_int,_8UL>::push_back
                          (&this->vars_needing_early_declaration,
                           (uint *)((long)&ptr_type.member_name_cache._M_h._M_single_bucket + 4));
                TypedID<(spirv_cross::Types)0>::TypedID
                          (&local_214,ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                          (&local_238,this,(ulong)BStack_58,3);
                Compiler::set_name((Compiler *)this,local_214,(string *)&local_238);
                ::std::__cxx11::string::~string((string *)&local_238);
                TypedID<(spirv_cross::Types)0>::TypedID
                          ((TypedID<(spirv_cross::Types)0> *)((long)&var_name.field_2 + 0xc),
                           ptr_type.member_name_cache._M_h._M_single_bucket._4_4_);
                Compiler::set_decoration
                          ((Compiler *)this,(ID)var_name.field_2._12_4_,BuiltIn,BStack_58);
                SPIRType::~SPIRType((SPIRType *)local_1f8);
              }
            }
            else if (((local_51 & 1) == 0) ||
                    (bVar3 = Compiler::has_active_builtin
                                       ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar3))
            {
              bVar3 = Compiler::is_matrix((Compiler *)this,_ptr_type_id);
              local_409 = true;
              if (!bVar3) {
                bVar3 = Compiler::is_array((Compiler *)this,_ptr_type_id);
                local_409 = true;
                if (!bVar3) {
                  local_409 = _ptr_type_id->basetype == Struct;
                }
              }
              var_name.field_2._M_local_buf[0xb] = local_409;
              local_40a = false;
              if (ib_var_ref_local._4_4_ == Input) {
                EVar6 = Compiler::get_execution_model((Compiler *)this);
                local_40a = EVar6 != ExecutionModelFragment;
              }
              var_name.field_2._M_local_buf[10] = local_40a;
              var_name.field_2._M_local_buf[9] =
                   variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
              if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
                local_51 = 0;
              }
              uVar5 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
              ts_1 = (uint *)0x1;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                        ((string *)(mbr_name_qual.field_2._M_local_buf + 8),this,(ulong)uVar5);
              ::std::__cxx11::string::string
                        ((string *)(var_chain_qual.field_2._M_local_buf + 8),
                         (string *)(mbr_name_qual.field_2._M_local_buf + 8));
              ::std::__cxx11::string::string
                        ((string *)local_2a0,(string *)(mbr_name_qual.field_2._M_local_buf + 8));
              if (1 < mbr_idx) {
                join<char_const(&)[2],unsigned_int&>
                          (&local_2c0,(spirv_cross *)0x66305e,(char (*) [2])&local_88,ts_1);
                ::std::__cxx11::string::operator+=
                          ((string *)(var_chain_qual.field_2._M_local_buf + 8),(string *)&local_2c0)
                ;
                ::std::__cxx11::string::~string((string *)&local_2c0);
                join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                          (&local_2e0,(spirv_cross *)0x623740,(char (*) [2])&local_88,
                           (uint *)0x6629fd,(char (*) [2])var);
                ::std::__cxx11::string::operator+=((string *)local_2a0,(string *)&local_2e0);
                ::std::__cxx11::string::~string((string *)&local_2e0);
              }
              storage_00 = ib_var_ref_local._4_4_;
              ib_var_ref_00 = ib_type_local;
              ib_type_00 = var_local;
              var = (SPIRVariable *)meta_local;
              meta_00 = entry_func;
              pSVar2 = _builtin;
              uVar5 = mbr_type._4_4_;
              if (((((local_51 & 1) == 0) || ((var_name.field_2._M_local_buf[10] & 1U) != 0)) &&
                  ((var_name.field_2._M_local_buf[9] & 1U) != 0)) &&
                 ((var_name.field_2._M_local_buf[0xb] & 1U) != 0)) {
                _Stack_300._M_next_resize = 0;
                p_Stack_2f0 = (__node_base_ptr)0x0;
                local_308 = 0;
                _Stack_300._M_max_load_factor = 0.0;
                _Stack_300._4_4_ = 0;
                local_318 = 0;
                _Stack_310._M_nxt = (_Hash_node_base *)0x0;
                _auStack_328 = 0;
                pp_Stack_320 = (__buckets_ptr)0x0;
                Bitset::Bitset((Bitset *)auStack_328);
                add_composite_member_variable_to_interface_block
                          (this,storage_00,(string *)ib_var_ref_00,(SPIRType *)ib_type_00,var,pSVar2
                           ,uVar5,(InterfaceBlockMeta *)meta_00,
                           (string *)((long)&var_chain_qual.field_2 + 8),(string *)local_2a0,
                           &elem_cnt,&elem_idx,(Bitset *)auStack_328);
                Bitset::~Bitset((Bitset *)auStack_328);
              }
              else {
                add_plain_member_variable_to_interface_block
                          (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local
                           ,(SPIRVariable *)meta_local,_builtin,mbr_type._4_4_,
                           (InterfaceBlockMeta *)entry_func,
                           (string *)((long)&var_chain_qual.field_2 + 8),(string *)local_2a0,
                           &elem_cnt,&elem_idx);
              }
              ::std::__cxx11::string::~string((string *)local_2a0);
              ::std::__cxx11::string::~string((string *)(var_chain_qual.field_2._M_local_buf + 8));
              ::std::__cxx11::string::~string((string *)(mbr_name_qual.field_2._M_local_buf + 8));
            }
            elem_idx = elem_idx + 1;
          }
        }
        if ((((var_mbr_idx._1_1_ & 1) != 0) && ((var_mbr_idx._2_1_ & 1) == 0)) &&
           ((bVar3 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local),
            !bVar3 || (bVar3 = is_tesc_shader(this), bVar3)))) {
          bVar3 = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
          if (bVar3) {
            for (local_32c = 0; uVar1 = local_32c,
                sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                  (&(_builtin->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
                uVar1 < (uint)sVar9; local_32c = local_32c + 1) {
              local_330.id = (uint32_t)
                             TypedID::operator_cast_to_TypedID
                                       ((TypedID *)&(_builtin->super_IVariant).self);
              uVar1 = local_32c;
              local_354 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(_builtin->super_IVariant).self);
              uVar5 = Compiler::get_member_decoration
                                ((Compiler *)this,(TypeID)local_354,local_32c,BuiltIn);
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        (&local_350,this,(ulong)uVar5,3);
              Compiler::set_member_name((Compiler *)this,local_330,uVar1,&local_350);
              ::std::__cxx11::string::~string((string *)&local_350);
            }
            local_358.id = (_builtin->super_IVariant).self.id;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_378,"gl_PerVertex",&local_379);
            Compiler::set_name((Compiler *)this,local_358,&local_378);
            ::std::__cxx11::string::~string((string *)&local_378);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
            local_380.id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_3a0,"gl_out_masked",(allocator *)&is_composite_type_1);
            Compiler::set_name((Compiler *)this,local_380,&local_3a0);
            ::std::__cxx11::string::~string((string *)&local_3a0);
            ::std::allocator<char>::~allocator((allocator<char> *)&is_composite_type_1);
            TVar7 = TypedID::operator_cast_to_TypedID((TypedID *)&(_builtin->super_IVariant).self);
            (this->stage_out_masked_builtin_type_id).id = TVar7.id;
          }
          emit_local_masked_variable
                    (this,(SPIRVariable *)meta_local,
                     (bool)((entry_func->arguments).stack_storage.aligned_char[8] & 1));
        }
      }
    }
    else {
      bVar3 = is_tese_shader(this);
      if ((((bVar3) && (ib_var_ref_local._4_4_ == Input)) &&
          (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0)) &&
         (((local_51 & 1) != 0 &&
          ((BStack_58 == BuiltInTessLevelOuter || (BStack_58 == BuiltInTessLevelInner)))))) {
        add_tess_level_input_to_interface_block
                  (this,(string *)ib_type_local,(SPIRType *)var_local,(SPIRVariable *)meta_local);
      }
      else if ((((_builtin->basetype == Boolean) || (_builtin->basetype == Char)) ||
               ((bVar3 = type_is_integral(_builtin), bVar3 ||
                (bVar3 = type_is_floating_point(_builtin), bVar3)))) &&
              (((local_51 & 1) == 0 ||
               (bVar3 = Compiler::has_active_builtin
                                  ((Compiler *)this,BStack_58,ib_var_ref_local._4_4_), bVar3)))) {
        bVar3 = Compiler::is_matrix((Compiler *)this,_builtin);
        local_471 = true;
        if (!bVar3) {
          local_471 = Compiler::is_array((Compiler *)this,_builtin);
        }
        bVar4 = variable_storage_requires_stage_io(this,ib_var_ref_local._4_4_);
        bVar3 = false;
        if (ib_var_ref_local._4_4_ == Input) {
          EVar6 = Compiler::get_execution_model((Compiler *)this);
          bVar3 = EVar6 != ExecutionModelFragment;
        }
        if ((BStack_58 == BuiltInClipDistance) || (BStack_58 == BuiltInCullDistance)) {
          local_51 = 0;
        }
        if (((((local_51 & 1) == 0) || (bVar3)) && (bVar4)) && (local_471 != false)) {
          add_composite_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
        else {
          add_plain_variable_to_interface_block
                    (this,ib_var_ref_local._4_4_,(string *)ib_type_local,(SPIRType *)var_local,
                     (SPIRVariable *)meta_local,(InterfaceBlockMeta *)entry_func);
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}